

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O2

Option * __thiscall
CLI::Option::type_size(Option *this,int option_type_size_min,int option_type_size_max)

{
  int iVar1;
  
  if ((option_type_size_max | option_type_size_min) < 0) {
    this->expected_max_ = 0x20000000;
    if (option_type_size_min < 1) {
      option_type_size_min = -option_type_size_min;
    }
    if (option_type_size_max < 1) {
      option_type_size_max = -option_type_size_max;
    }
  }
  iVar1 = option_type_size_max;
  if (option_type_size_max < option_type_size_min) {
    iVar1 = option_type_size_min;
  }
  if (option_type_size_min < option_type_size_max) {
    option_type_size_max = option_type_size_min;
  }
  this->type_size_max_ = iVar1;
  this->type_size_min_ = option_type_size_max;
  if (iVar1 != 0) {
    if (0x1fffffff < iVar1) {
      this->inject_separator_ = true;
    }
    return this;
  }
  (this->super_OptionBase<CLI::Option>).required_ = false;
  return this;
}

Assistant:

CLI11_INLINE Option *Option::type_size(int option_type_size_min, int option_type_size_max) {
    if(option_type_size_min < 0 || option_type_size_max < 0) {
        // this section is included for backwards compatibility
        expected_max_ = detail::expected_max_vector_size;
        option_type_size_min = (std::abs)(option_type_size_min);
        option_type_size_max = (std::abs)(option_type_size_max);
    }

    if(option_type_size_min > option_type_size_max) {
        type_size_max_ = option_type_size_min;
        type_size_min_ = option_type_size_max;
    } else {
        type_size_min_ = option_type_size_min;
        type_size_max_ = option_type_size_max;
    }
    if(type_size_max_ == 0) {
        required_ = false;
    }
    if(type_size_max_ >= detail::expected_max_vector_size) {
        inject_separator_ = true;
    }
    return this;
}